

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O3

void __thiscall icu_63::UVector::removeAllElements(UVector *this)

{
  int iVar1;
  long lVar2;
  
  if (this->deleter != (UObjectDeleter *)0x0) {
    iVar1 = this->count;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if (this->elements[lVar2].pointer != (void *)0x0) {
          (*this->deleter)(this->elements[lVar2].pointer);
          iVar1 = this->count;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
  }
  this->count = 0;
  return;
}

Assistant:

void UVector::removeAllElements(void) {
    if (deleter != 0) {
        for (int32_t i=0; i<count; ++i) {
            if (elements[i].pointer != 0) {
                (*deleter)(elements[i].pointer);
            }
        }
    }
    count = 0;
}